

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O1

h2o_hostinfo_getaddr_req_t *
h2o_hostinfo_getaddr
          (h2o_multithread_receiver_t *receiver,h2o_iovec_t name,h2o_iovec_t serv,int family,
          int socktype,int protocol,int flags,h2o_hostinfo_getaddr_cb cb,void *cbdata)

{
  h2o_hostinfo_getaddr_req_t *req;
  size_t __n;
  char *__dest;
  size_t __n_00;
  
  __n_00 = serv.len;
  __n = name.len;
  req = (h2o_hostinfo_getaddr_req_t *)malloc(__n + __n_00 + 0x6a);
  if (req != (h2o_hostinfo_getaddr_req_t *)0x0) {
    req->_receiver = receiver;
    req->_cb = cb;
    req->cbdata = cbdata;
    (req->_pending).next = (st_h2o_linklist_t *)0x0;
    (req->_pending).prev = (st_h2o_linklist_t *)0x0;
    (req->field_4)._in.name = (char *)(req + 1);
    memcpy(req + 1,name.base,__n);
    *(undefined1 *)((long)&req[1]._receiver + __n) = 0;
    __dest = (req->field_4)._in.name + __n + 1;
    (req->field_4)._in.serv = __dest;
    memcpy(__dest,serv.base,__n_00);
    (req->field_4)._in.serv[__n_00] = '\0';
    (req->field_4)._out.errstr = (char *)0x0;
    (req->field_4)._out.ai = (addrinfo *)0x0;
    *(undefined8 *)((long)&req->field_4 + 0x30) = 0;
    *(undefined8 *)((long)&req->field_4 + 0x38) = 0;
    *(undefined8 *)((long)&req->field_4 + 0x20) = 0;
    *(undefined8 *)((long)&req->field_4 + 0x28) = 0;
    (req->field_4)._in.hints.ai_family = family;
    (req->field_4)._in.hints.ai_socktype = socktype;
    (req->field_4)._in.hints.ai_protocol = protocol;
    (req->field_4)._in.hints.ai_flags = flags;
    h2o__hostinfo_getaddr_dispatch(req);
    return req;
  }
  h2o__fatal(
            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
            );
}

Assistant:

h2o_hostinfo_getaddr_req_t *h2o_hostinfo_getaddr(h2o_multithread_receiver_t *receiver, h2o_iovec_t name, h2o_iovec_t serv,
                                                 int family, int socktype, int protocol, int flags, h2o_hostinfo_getaddr_cb cb,
                                                 void *cbdata)
{
    h2o_hostinfo_getaddr_req_t *req = h2o_mem_alloc(sizeof(*req) + name.len + 1 + serv.len + 1);
    req->_receiver = receiver;
    req->_cb = cb;
    req->cbdata = cbdata;
    req->_pending = (h2o_linklist_t){NULL};
    req->_in.name = (char *)req + sizeof(*req);
    memcpy(req->_in.name, name.base, name.len);
    req->_in.name[name.len] = '\0';
    req->_in.serv = req->_in.name + name.len + 1;
    memcpy(req->_in.serv, serv.base, serv.len);
    req->_in.serv[serv.len] = '\0';
    memset(&req->_in.hints, 0, sizeof(req->_in.hints));
    req->_in.hints.ai_family = family;
    req->_in.hints.ai_socktype = socktype;
    req->_in.hints.ai_protocol = protocol;
    req->_in.hints.ai_flags = flags;

    h2o__hostinfo_getaddr_dispatch(req);

    return req;
}